

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O2

void __thiscall
NewEdgeCalculator::NewEdgeCalculator
          (NewEdgeCalculator *this,double Q,double edge_quasi_cutoff,double overlap,
          bool frameshift_merge,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *simpson_map,double edge_quasi_cutoff_single,double overlap_single,
          double edge_quasi_cutoff_mixed,uint maxPosition,bool noProb0)

{
  pointer pdVar1;
  __node_base *p_Var2;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator = (_func_int **)&PTR__NewEdgeCalculator_001d6e88
  ;
  (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aub).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aub).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aub).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Q = Q;
  this->EDGE_QUASI_CUTOFF = edge_quasi_cutoff;
  this->EDGE_QUASI_CUTOFF_SINGLE = edge_quasi_cutoff_single;
  this->EDGE_QUASI_CUTOFF_MIXED = edge_quasi_cutoff_mixed;
  this->MIN_OVERLAP_CLIQUES = overlap;
  this->MIN_OVERLAP_SINGLE = overlap_single;
  this->FRAMESHIFT_MERGE = frameshift_merge;
  std::vector<double,_std::allocator<double>_>::resize(&this->SIMPSON_MAP,(ulong)(maxPosition + 1));
  p_Var2 = &(simpson_map->_M_h)._M_before_begin;
  pdVar1 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    pdVar1[(int)*(size_type *)(p_Var2 + 1)] =
         (double)*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
  }
  this->NOPROB0 = noProb0;
  return;
}

Assistant:

NewEdgeCalculator::NewEdgeCalculator(double Q, double edge_quasi_cutoff, double overlap, bool frameshift_merge, unordered_map<int, double>& simpson_map, double edge_quasi_cutoff_single, double overlap_single, double edge_quasi_cutoff_mixed, unsigned int maxPosition, bool noProb0) {
    this->Q = Q;
    this->EDGE_QUASI_CUTOFF = edge_quasi_cutoff;
    this->EDGE_QUASI_CUTOFF_SINGLE = edge_quasi_cutoff_single;
    this->EDGE_QUASI_CUTOFF_MIXED = edge_quasi_cutoff_mixed;
    this->MIN_OVERLAP_CLIQUES = overlap;
    this->MIN_OVERLAP_SINGLE = overlap_single;
    this->FRAMESHIFT_MERGE = frameshift_merge;
    this->SIMPSON_MAP.resize(maxPosition+1);
    for(auto& k_v : simpson_map){
        this->SIMPSON_MAP[k_v.first] = k_v.second;
    }
    this->NOPROB0 = noProb0;
}